

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_packing_pass.cpp
# Opt level: O3

PackingRules spvtools::opt::StructPackingPass::ParsePackingRuleFromString(string *s)

{
  int iVar1;
  PackingRules PVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)s);
  if (iVar1 == 0) {
    PVar2 = Std140;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)s);
    if (iVar1 == 0) {
      PVar2 = Std140EnhancedLayout;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)s);
      if (iVar1 == 0) {
        PVar2 = Std430;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)s);
        if (iVar1 == 0) {
          PVar2 = Std430EnhancedLayout;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)s);
          if (iVar1 == 0) {
            PVar2 = HlslCbuffer;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)s);
            if (iVar1 == 0) {
              PVar2 = HlslCbufferPackOffset;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)s);
              if (iVar1 == 0) {
                PVar2 = Scalar;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)s);
                PVar2 = (uint)(iVar1 == 0) << 3;
              }
            }
          }
        }
      }
    }
  }
  return PVar2;
}

Assistant:

StructPackingPass::PackingRules StructPackingPass::ParsePackingRuleFromString(
    const std::string& s) {
  if (s == "std140") return PackingRules::Std140;
  if (s == "std140EnhancedLayout") return PackingRules::Std140EnhancedLayout;
  if (s == "std430") return PackingRules::Std430;
  if (s == "std430EnhancedLayout") return PackingRules::Std430EnhancedLayout;
  if (s == "hlslCbuffer") return PackingRules::HlslCbuffer;
  if (s == "hlslCbufferPackOffset") return PackingRules::HlslCbufferPackOffset;
  if (s == "scalar") return PackingRules::Scalar;
  if (s == "scalarEnhancedLayout") return PackingRules::ScalarEnhancedLayout;
  return PackingRules::Undefined;
}